

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool memequals(void *s1,void *s2,size_t n)

{
  long lVar1;
  int iVar2;
  _Bool _Var3;
  
  if (n == 0) {
    _Var3 = true;
  }
  else {
    lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar1 + 4) & 0x20) != 0) {
      _Var3 = _avx2_memequals(s1,s2,n);
      return _Var3;
    }
    iVar2 = bcmp(s1,s2,n);
    _Var3 = iVar2 == 0;
  }
  return _Var3;
}

Assistant:

bool memequals(const void *s1, const void *s2, size_t n) {
    if (n == 0) {
        return true;
    }
#ifdef CROARING_IS_X64
    if( croaring_avx2() ) {
      return _avx2_memequals(s1, s2, n);
    } else {
      return memcmp(s1, s2, n) == 0;
    }
#else
    return memcmp(s1, s2, n) == 0;
#endif
}